

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_util.hpp
# Opt level: O2

idx_t duckdb::EncodingUtil::EncodeUnsignedLEB128<unsigned_int>(data_ptr_t target,uint value)

{
  bool bVar1;
  idx_t iVar2;
  ulong uVar3;
  
  iVar2 = 0;
  uVar3 = (ulong)value;
  do {
    uVar3 = uVar3 >> 7;
    target[iVar2] = (0x7f < value) << 7 | (byte)value & 0x7f;
    iVar2 = iVar2 + 1;
    bVar1 = 0x7f < value;
    value = (uint)uVar3;
  } while (bVar1);
  return iVar2;
}

Assistant:

static idx_t EncodeUnsignedLEB128(data_ptr_t target, T value) {
		static_assert(std::is_integral<T>::value, "Must be integral");
		static_assert(std::is_unsigned<T>::value, "Must be unsigned");
		static_assert(sizeof(T) <= sizeof(uint64_t), "Must be uint64_t or smaller");

		idx_t offset = 0;
		do {
			uint8_t byte = value & 0x7F;
			value >>= 7;
			if (value != 0) {
				byte |= 0x80;
			}
			target[offset++] = byte;
		} while (value != 0);
		return offset;
	}